

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

void __thiscall Patch::delete_node(Patch *this,Node **node_to_delete)

{
  Node *this_00;
  bool bVar1;
  reference ppNVar2;
  Node *node;
  Node **node_to_delete_local;
  Patch *this_local;
  
  if (*node_to_delete != (Node *)0x0) {
    std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::clear(&this->node_stack);
    std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
              (&this->node_stack,node_to_delete);
    while( true ) {
      bVar1 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::empty(&this->node_stack);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppNVar2 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::back(&this->node_stack);
      this_00 = *ppNVar2;
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::pop_back(&this->node_stack);
      if (this_00->left != (Node *)0x0) {
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                  (&this->node_stack,&this_00->left);
      }
      if (this_00->right != (Node *)0x0) {
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                  (&this->node_stack,&this_00->right);
      }
      if (this_00 != (Node *)0x0) {
        Node::~Node(this_00);
        operator_delete(this_00,0x50);
      }
      this->change_count = this->change_count - 1;
    }
    *node_to_delete = (Node *)0x0;
  }
  return;
}

Assistant:

void Patch::delete_node(Node **node_to_delete) {
  if (*node_to_delete) {
    node_stack.clear();
    node_stack.push_back(*node_to_delete);

    while (!node_stack.empty()) {
      Node *node = node_stack.back();
      node_stack.pop_back();
      if (node->left)
        node_stack.push_back(node->left);
      if (node->right)
        node_stack.push_back(node->right);
      delete node;
      change_count--;
    }

    *node_to_delete = nullptr;
  }
}